

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O1

void pzshape::TPZShapePrism::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  uint num;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *pdVar8;
  long *plVar9;
  bool bVar10;
  int iVar11;
  int xj_1;
  long lVar12;
  TPZVec<double> *pt_00;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  TPZVec<int> *pTVar18;
  int iVar19;
  long lVar20;
  int (*paiVar21) [4];
  int xj;
  long lVar22;
  TPZFMatrix<double> dphin_1;
  TPZFMatrix<double> phin_1;
  TPZVec<long> ids;
  TPZManVector<double,_1> outvalvec;
  TPZFNMatrix<60,_double> phin;
  TPZFNMatrix<60,_double> dphin;
  TPZFNMatrix<100,_double> phiblend;
  TPZFNMatrix<100,_double> dphiblend;
  long local_ec8;
  long local_ea8;
  long local_e90;
  TPZFMatrix<double> local_e60;
  TPZFMatrix<double> local_dd0;
  TPZVec<int> *local_d40;
  TPZVec<long> *local_d38;
  TPZVec<double> local_d30;
  _func_int **local_d10;
  TPZManVector<long,_10> local_d08;
  TPZFMatrix<double> local_c98;
  double local_c08 [62];
  TPZFMatrix<double> local_a18;
  double local_988 [61];
  TPZFMatrix<double> local_7a0;
  double local_710 [101];
  TPZFMatrix<double> local_3e8;
  double local_358 [101];
  
  local_d38 = id;
  CornerShape(pt,phi,dphi);
  bVar10 = true;
  lVar12 = 0;
  do {
    if (1 < order->fStore[lVar12]) {
      bVar10 = false;
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0xf);
  if (!bVar10) {
    local_7a0.fElem = local_710;
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0x15;
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0185f360;
    local_7a0.fSize = 100;
    local_d40 = order;
    local_7a0.fGiven = local_7a0.fElem;
    TPZVec<int>::TPZVec(&local_7a0.fPivot.super_TPZVec<int>,0);
    local_7a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_7a0.fPivot.super_TPZVec<int>.fStore = local_7a0.fPivot.fExtAlloc;
    local_7a0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_7a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_7a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_7a0.fWork.fStore = (double *)0x0;
    local_7a0.fWork.fNElements = 0;
    local_7a0.fWork.fNAlloc = 0;
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0185f070;
    local_3e8.fElem = local_358;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0x15;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0185f360;
    local_3e8.fSize = 100;
    pt_00 = (TPZVec<double> *)&local_3e8.fPivot;
    local_3e8.fGiven = local_3e8.fElem;
    TPZVec<int>::TPZVec((TPZVec<int> *)pt_00,0);
    local_3e8.fPivot.super_TPZVec<int>.fStore = local_3e8.fPivot.fExtAlloc;
    local_3e8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_3e8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_3e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_3e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_3e8.fWork.fStore = (double *)0x0;
    local_3e8.fWork.fNElements = 0;
    local_3e8.fWork.fNAlloc = 0;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0185f070;
    lVar16 = 0;
    lVar12 = 0;
    do {
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar12) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar12) ||
         (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_7a0.fElem[lVar12] = phi->fElem[lVar12];
      lVar20 = 0;
      do {
        if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar20) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar12)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar20) ||
           (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar12)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined8 *)
         ((long)local_3e8.fElem +
         lVar20 * 8 + local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar16) =
             *(undefined8 *)
              ((long)dphi->fElem +
              lVar20 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar16);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 3);
      lVar12 = lVar12 + 1;
      lVar16 = lVar16 + 8;
    } while (lVar12 != 6);
    ShapeGenerating(pt_00,&local_7a0,&local_3e8);
    local_ec8 = 6;
    local_ea8 = 0x30;
    local_d10 = (_func_int **)&PTR__TPZVec_0183b5f0;
    lVar12 = 0;
    pTVar18 = local_d40;
    do {
      pdVar8 = pt->fStore;
      dVar1 = (double)(&gRibTrans3dPrisma1d)[lVar12 * 3];
      dVar2 = (double)(&DAT_01a58808)[lVar12 * 3];
      dVar3 = pdVar8[1];
      dVar4 = *pdVar8;
      dVar5 = (double)(&DAT_01a58810)[lVar12 * 3];
      dVar6 = pdVar8[2];
      dVar7 = (double)(&gRibSum3dPrisma1d)[lVar12];
      TPZVec<long>::TPZVec((TPZVec<long> *)&local_d30,2);
      TPZVec<double>::TPZVec((TPZVec<double> *)&local_d08,0);
      local_d08.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018df490;
      local_d08.super_TPZVec<long>.fStore = local_d08.fExtAlloc;
      local_d08.super_TPZVec<long>.fNElements = 1;
      local_d08.super_TPZVec<long>.fNAlloc = 0;
      iVar19 = pztopology::TPZPrism::SideNodes[lVar12][1];
      plVar9 = local_d38->fStore;
      *local_d30.fStore = (double)plVar9[pztopology::TPZPrism::SideNodes[lVar12][0]];
      local_d30.fStore[1] = (double)plVar9[iVar19];
      iVar19 = pTVar18->fStore[lVar12];
      num = iVar19 - 1;
      lVar16 = (long)(int)num;
      local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0183c898;
      local_dd0.fElem = (double *)&local_a18;
      local_dd0.fSize = 0x14;
      local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar16;
      local_dd0.fGiven = local_dd0.fElem;
      local_d08.fExtAlloc[0] = (long)(dVar5 * dVar6 + dVar1 * dVar4 + dVar2 * dVar3 + dVar7);
      TPZVec<int>::TPZVec(&local_dd0.fPivot.super_TPZVec<int>,0);
      local_dd0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_dd0.fPivot.super_TPZVec<int>.fStore = local_dd0.fPivot.fExtAlloc;
      local_dd0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_dd0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_dd0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_dd0.fWork.fStore = (double *)0x0;
      local_dd0.fWork.fNElements = 0;
      local_dd0.fWork.fNAlloc = 0;
      if (num == 0) {
        local_dd0.fElem = (double *)0x0;
      }
      else if (0x15 < iVar19) {
        local_dd0.fElem = (double *)operator_new__(lVar16 * 8);
      }
      local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
      local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0183c898;
      local_e60.fElem = (double *)&local_c98;
      local_e60.fSize = 0x3c;
      local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar16;
      local_e60.fGiven = local_e60.fElem;
      TPZVec<int>::TPZVec(&local_e60.fPivot.super_TPZVec<int>,0);
      local_e60.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_e60.fPivot.super_TPZVec<int>.fStore = local_e60.fPivot.fExtAlloc;
      local_e60.fPivot.super_TPZVec<int>.fNElements = 0;
      local_e60.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_e60.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_e60.fWork.fStore = (double *)0x0;
      local_e60.fWork.fNElements = 0;
      local_e60.fWork.fNAlloc = 0;
      if (num == 0) {
        local_e60.fElem = (double *)0x0;
      }
      else if (0x15 < iVar19) {
        uVar13 = lVar16 * 0x18;
        if (0x1fffffffffffffff < (ulong)(lVar16 * 3)) {
          uVar13 = 0xffffffffffffffff;
        }
        local_e60.fElem = (double *)operator_new__(uVar13);
      }
      memset(local_dd0.fElem,0,
             local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
           local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
      memset(local_e60.fElem,0,
             local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
           local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
      iVar15 = pTVar18->fStore[lVar12];
      iVar11 = TPZShapeLinear::GetTransformId1d((TPZVec<long> *)&local_d30);
      TPZShapeLinear::ShapeInternal
                ((TPZVec<double> *)&local_d08,iVar15,&local_dd0,&local_e60,iVar11);
      TransformDerivativeFromRibToPrisma((int)lVar12,num,&local_e60);
      if (1 < iVar19) {
        lVar16 = lVar12 + 6;
        local_ec8 = (long)(int)local_ec8;
        lVar20 = local_ec8 * 8;
        lVar17 = 0;
        uVar13 = 0;
        do {
          if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
             (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar13) ||
             (local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((local_ec8 < 0) ||
              ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_ec8)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[local_ec8] =
               local_7a0.fElem[lVar12 + 6] *
               *(double *)
                ((long)(&((TPZFMatrix<double> *)
                         (&((TPZFMatrix<double> *)
                           ((TPZManVector<int,_5> *)((long)local_dd0.fElem + 0x38) + -1))->fPivot +
                         -1))->fPivot + 0xffffffffffffffff) + uVar13 * 8);
          lVar22 = 0;
          do {
            if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar22) ||
               (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar16)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar13) ||
               (local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
               (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar22) ||
               (local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar13)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar22) ||
                (local_ec8 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_ec8)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(double *)
             ((long)dphi->fElem +
             lVar22 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar20) =
                 *(double *)
                  ((long)local_3e8.fElem +
                  lVar22 * 8 +
                  local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_ea8) *
                 *(double *)
                  ((long)(&((TPZFMatrix<double> *)
                           (&((TPZFMatrix<double> *)
                             ((TPZManVector<int,_5> *)((long)local_dd0.fElem + 0x38) + -1))->fPivot
                           + -1))->fPivot + 0xffffffffffffffff) + uVar13 * 8) +
                 local_7a0.fElem[lVar12 + 6] *
                 *(double *)
                  ((long)(&((TPZFMatrix<double> *)
                           (&((TPZFMatrix<double> *)
                             ((TPZManVector<int,_5> *)((long)local_e60.fElem + 0x38) + -1))->fPivot
                           + -1))->fPivot + 0xffffffffffffffff) +
                  lVar22 * 8 + local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar17);
            lVar22 = lVar22 + 1;
          } while (lVar22 != 3);
          local_ec8 = local_ec8 + 1;
          uVar13 = uVar13 + 1;
          lVar17 = lVar17 + 8;
          lVar20 = lVar20 + 8;
          pTVar18 = local_d40;
        } while (uVar13 != num);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_e60);
      TPZFMatrix<double>::~TPZFMatrix(&local_dd0);
      if (local_d08.super_TPZVec<long>.fStore == local_d08.fExtAlloc) {
        local_d08.super_TPZVec<long>.fStore = (long *)0x0;
      }
      local_d08.super_TPZVec<long>.fNAlloc = 0;
      local_d08.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      if (local_d08.super_TPZVec<long>.fStore != (long *)0x0) {
        operator_delete__(local_d08.super_TPZVec<long>.fStore);
      }
      local_d30._vptr_TPZVec = local_d10;
      if (local_d30.fStore != (double *)0x0) {
        operator_delete__(local_d30.fStore);
      }
      lVar12 = lVar12 + 1;
      local_ea8 = local_ea8 + 8;
    } while (lVar12 != 9);
    paiVar21 = pztopology::TPZPrism::FaceNodes;
    local_ea8 = 0x78;
    uVar13 = 0;
    do {
      if (((uVar13 & 3) != 0) || (pTVar18->fStore[uVar13 + 9] != 2)) {
        TPZVec<double>::TPZVec(&local_d30,2);
        ProjectPoint3dPrismaToFace((int)uVar13,pt,&local_d30);
        iVar19 = pTVar18->fStore[uVar13 + 9];
        if (((uVar13 & 3) != 0) || (2 < iVar19)) {
          if ((uVar13 & 3) == 0) {
            iVar15 = ((iVar19 + -1) * (iVar19 + -2)) / 2;
          }
          else {
            iVar15 = (iVar19 + -1) * (iVar19 + -1);
          }
          lVar12 = (long)iVar15;
          local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
          local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0183c898;
          local_dd0.fElem = (double *)&local_a18;
          local_dd0.fSize = 0x14;
          local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar12;
          local_dd0.fGiven = local_dd0.fElem;
          TPZVec<int>::TPZVec(&local_dd0.fPivot.super_TPZVec<int>,0);
          local_dd0.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_dd0.fPivot.super_TPZVec<int>.fStore = local_dd0.fPivot.fExtAlloc;
          local_dd0.fPivot.super_TPZVec<int>.fNElements = 0;
          local_dd0.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_dd0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_dd0.fWork.fStore = (double *)0x0;
          local_dd0.fWork.fNElements = 0;
          local_dd0.fWork.fNAlloc = 0;
          if (iVar15 == 0) {
            local_dd0.fElem = (double *)0x0;
          }
          else if (0x14 < iVar15) {
            local_dd0.fElem = (double *)operator_new__(lVar12 * 8);
          }
          local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
          local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_0183c898;
          local_e60.fElem = (double *)&local_c98;
          local_e60.fSize = 0x3c;
          local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar12;
          local_e60.fGiven = local_e60.fElem;
          TPZVec<int>::TPZVec(&local_e60.fPivot.super_TPZVec<int>,0);
          local_e60.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_0183cde8;
          local_e60.fPivot.super_TPZVec<int>.fStore = local_e60.fPivot.fExtAlloc;
          local_e60.fPivot.super_TPZVec<int>.fNElements = 0;
          local_e60.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_e60.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
          local_e60.fWork.fStore = (double *)0x0;
          local_e60.fWork.fNElements = 0;
          local_e60.fWork.fNAlloc = 0;
          if (iVar15 == 0) {
            local_e60.fElem = (double *)0x0;
          }
          else if (0x14 < iVar15) {
            uVar14 = lVar12 * 0x18;
            if (0x1fffffffffffffff < (ulong)(lVar12 * 3)) {
              uVar14 = 0xffffffffffffffff;
            }
            local_e60.fElem = (double *)operator_new__(uVar14);
          }
          memset(local_dd0.fElem,0,
                 local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
                 local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
          local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
               local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
          memset(local_e60.fElem,0,
                 local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
                 local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
          local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
               local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
          TPZManVector<long,_10>::TPZManVector(&local_d08,4);
          if ((uVar13 & 3) == 0) {
            plVar9 = local_d38->fStore;
            lVar16 = 0;
            do {
              local_d08.super_TPZVec<long>.fStore[lVar16] = plVar9[(*paiVar21)[lVar16]];
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
          }
          else {
            plVar9 = local_d38->fStore;
            lVar16 = 0;
            do {
              local_d08.super_TPZVec<long>.fStore[lVar16] = plVar9[(*paiVar21)[lVar16]];
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
          }
          if ((uVar13 & 3) == 0) {
            TPZManVector<long,_10>::Resize(&local_d08,3);
            iVar11 = TPZShapeTriang::GetTransformId2dT(&local_d08.super_TPZVec<long>);
            *local_d30.fStore = (*local_d30.fStore + 1.0) * 0.5;
            local_d30.fStore[1] = (local_d30.fStore[1] + 1.0) * 0.5;
            TPZShapeTriang::ShapeInternal(&local_d30,iVar19 + -2,&local_dd0,&local_e60,iVar11);
            if (0 < (int)(uint)local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol) {
              uVar14 = 0;
              do {
                if ((local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
                   (local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar14)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)
                 ((long)(&((TPZFMatrix<double> *)
                          (&((TPZFMatrix<double> *)
                            ((TPZManVector<int,_5> *)((long)local_e60.fElem + 0x38) + -1))->fPivot +
                          -1))->fPivot + 0xffffffffffffffff) +
                 local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar14 * 8) =
                     *(double *)
                      ((long)(&((TPZFMatrix<double> *)
                               (&((TPZFMatrix<double> *)
                                 ((TPZManVector<int,_5> *)((long)local_e60.fElem + 0x38) + -1))->
                                 fPivot + -1))->fPivot + 0xffffffffffffffff) +
                      local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar14 * 8) * 0.5
                ;
                if ((local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
                   (local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar14)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)
                 (((TPZManVector<int,_5> *)((long)local_e60.fElem + 0x38))->fExtAlloc +
                 local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar14 * 2 + -0x14) =
                     *(double *)
                      (((TPZManVector<int,_5> *)((long)local_e60.fElem + 0x38))->fExtAlloc +
                      local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar14 * 2 +
                      -0x14) * 0.5;
                uVar14 = uVar14 + 1;
              } while (((uint)local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol &
                       0x7fffffff) != uVar14);
            }
          }
          else {
            iVar11 = TPZShapeQuad::GetTransformId2dQ(&local_d08.super_TPZVec<long>);
            TPZShapeQuad::ShapeInternal(&local_d30,iVar19 + -2,&local_dd0,&local_e60,iVar11);
          }
          TransformDerivativeFromFaceToPrisma((int)uVar13,iVar15,&local_e60);
          if (0 < iVar15) {
            lVar16 = uVar13 + 0xf;
            local_ec8 = (long)(int)local_ec8;
            local_e90 = local_ec8 * 8;
            lVar20 = 0;
            lVar17 = 0;
            do {
              if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
                 (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar17) ||
                 (local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (((local_ec8 < 0) ||
                  ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_ec8)) ||
                 ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              phi->fElem[local_ec8] =
                   local_7a0.fElem[uVar13 + 0xf] *
                   *(double *)
                    ((long)(&((TPZFMatrix<double> *)
                             (&((TPZFMatrix<double> *)
                               ((TPZManVector<int,_5> *)((long)local_dd0.fElem + 0x38) + -1))->
                               fPivot + -1))->fPivot + 0xffffffffffffffff) + lVar17 * 8);
              lVar22 = 0;
              do {
                if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar22) ||
                   (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar16)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar17) ||
                   (local_dd0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
                   (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar22) ||
                   (local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar17)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar22) ||
                    (local_ec8 < 0)) ||
                   ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_ec8)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)
                 ((long)dphi->fElem +
                 lVar22 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * local_e90)
                     = *(double *)
                        ((long)local_3e8.fElem +
                        lVar22 * 8 +
                        local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_ea8) *
                       *(double *)
                        ((long)(&((TPZFMatrix<double> *)
                                 (&((TPZFMatrix<double> *)
                                   ((TPZManVector<int,_5> *)((long)local_dd0.fElem + 0x38) + -1))->
                                   fPivot + -1))->fPivot + 0xffffffffffffffff) + lVar17 * 8) +
                       local_7a0.fElem[uVar13 + 0xf] *
                       *(double *)
                        ((long)(&((TPZFMatrix<double> *)
                                 (&((TPZFMatrix<double> *)
                                   ((TPZManVector<int,_5> *)((long)local_e60.fElem + 0x38) + -1))->
                                   fPivot + -1))->fPivot + 0xffffffffffffffff) +
                        lVar22 * 8 +
                        local_e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar20);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 3);
              local_ec8 = local_ec8 + 1;
              lVar17 = lVar17 + 1;
              lVar20 = lVar20 + 8;
              local_e90 = local_e90 + 8;
            } while (lVar17 != lVar12);
          }
          TPZManVector<long,_10>::~TPZManVector(&local_d08);
          TPZFMatrix<double>::~TPZFMatrix(&local_e60);
          TPZFMatrix<double>::~TPZFMatrix(&local_dd0);
          pTVar18 = local_d40;
        }
        local_d30._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
        if (local_d30.fStore != (double *)0x0) {
          operator_delete__(local_d30.fStore);
        }
      }
      uVar13 = uVar13 + 1;
      paiVar21 = paiVar21 + 1;
      local_ea8 = local_ea8 + 8;
    } while (uVar13 != 5);
    iVar19 = pTVar18->fStore[0xe];
    if (2 < iVar19) {
      iVar19 = (iVar19 + -2) * (iVar19 + -1) * (iVar19 + -1);
      lVar12 = (long)(iVar19 / 2);
      local_c98.fElem = local_c08;
      local_c98.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_c98.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_c98.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_c98.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0183ef60;
      local_c98.fSize = 0x3c;
      local_c98.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar12;
      local_c98.fGiven = local_c98.fElem;
      TPZVec<int>::TPZVec(&local_c98.fPivot.super_TPZVec<int>,0);
      local_c98.fPivot.super_TPZVec<int>.fStore = local_c98.fPivot.fExtAlloc;
      local_c98.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_c98.fPivot.super_TPZVec<int>.fNElements = 0;
      local_c98.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_c98.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_c98.fWork.fStore = (double *)0x0;
      local_c98.fWork.fNElements = 0;
      local_c98.fWork.fNAlloc = 0;
      if (iVar19 + 1U < 3) {
        local_c98.fElem = (double *)0x0;
      }
      else if (0x79 < iVar19) {
        local_c98.fElem = (double *)operator_new__(lVar12 * 8);
      }
      local_c98.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_0183ec70;
      local_a18.fElem = local_988;
      local_a18.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
      local_a18.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_a18.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_a18.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_0183ef60;
      local_a18.fSize = 0x3c;
      local_a18.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar12;
      local_a18.fGiven = local_a18.fElem;
      TPZVec<int>::TPZVec(&local_a18.fPivot.super_TPZVec<int>,0);
      local_a18.fPivot.super_TPZVec<int>.fStore = local_a18.fPivot.fExtAlloc;
      local_a18.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_a18.fPivot.super_TPZVec<int>.fNElements = 0;
      local_a18.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_a18.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      local_a18.fWork.fStore = (double *)0x0;
      local_a18.fWork.fNElements = 0;
      local_a18.fWork.fNAlloc = 0;
      if (iVar19 + 1U < 3) {
        local_a18.fElem = (double *)0x0;
      }
      else if (0x29 < iVar19) {
        uVar13 = 0xffffffffffffffff;
        if ((ulong)(lVar12 * 3) < 0x2000000000000000) {
          uVar13 = lVar12 * 0x18;
        }
        local_a18.fElem = (double *)operator_new__(uVar13);
      }
      local_a18.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_0183ec70;
      memset(local_c98.fElem,0,
             local_c98.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             local_c98.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      local_c98.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
           local_c98.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
      memset(local_a18.fElem,0,
             local_a18.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             local_a18.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      local_a18.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
           local_a18.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
      ShapeInternal(pt,pTVar18->fStore[0xe],&local_c98,&local_a18);
      if (1 < iVar19) {
        local_ea8 = (long)(int)local_ec8;
        local_e90 = local_ea8 * 8;
        local_ec8 = 0;
        lVar16 = 0;
        do {
          if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 0x15) ||
             (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_c98.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
             (local_c98.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((local_ea8 < 0) ||
              ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_ea8)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[local_ea8] = local_7a0.fElem[0x14] * local_c98.fElem[lVar16];
          lVar20 = 0;
          do {
            if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar20) ||
               (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 0x15)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_c98.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
               (local_c98.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 0x15) ||
               (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_a18.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar20) ||
               (local_a18.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar16)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar20) ||
                (local_ea8 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_ea8)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(double *)
             ((long)dphi->fElem +
             lVar20 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * local_e90) =
                 local_3e8.fElem
                 [local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 0x14 + lVar20] *
                 local_c98.fElem[lVar16] +
                 local_7a0.fElem[0x14] *
                 *(double *)
                  ((long)local_a18.fElem +
                  lVar20 * 8 +
                  local_a18.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_ec8);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 3);
          local_ea8 = local_ea8 + 1;
          lVar16 = lVar16 + 1;
          local_ec8 = local_ec8 + 8;
          local_e90 = local_e90 + 8;
        } while (lVar16 != lVar12);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_a18,&PTR_PTR_0183ef28);
      TPZFMatrix<double>::~TPZFMatrix(&local_c98,&PTR_PTR_0183ef28);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_3e8,&PTR_PTR_0185f328);
    TPZFMatrix<double>::~TPZFMatrix(&local_7a0,&PTR_PTR_0185f328);
  }
  return;
}

Assistant:

void TPZShapePrism::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		CornerShape(pt,phi,dphi);
		bool linear = true;
		int is,d;
		for(is=NCornerNodes; is<NSides; is++) if(order[is-NCornerNodes] > 1) linear = false;
		if(linear) return;
		
		TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		//  if(order[14]<2) return;//order tem as ordens dos lados do elemento
		int shape = 6;
		//rib shapes
		for (int rib = 0; rib < 9; rib++) {//todas as arestas
			REAL outval;
			ProjectPoint3dPrismaToRib(rib,pt,outval);
			TPZVec<int64_t> ids(2);
			TPZManVector<REAL,1> outvalvec(1,outval);
			int id0,id1;
			id0 = SideNodes[rib][0];
			id1 = SideNodes[rib][1];
			ids[0] = id[id0];
			ids[1] = id[id1];
			REAL store1[20],store2[60];
			int nshape = order[rib]-1;//three orders : order in x , order in y and order in z
			TPZFMatrix<REAL> phin(nshape,1,store1,20),dphin(3,nshape,store2,60);
			phin.Zero();
			dphin.Zero();
			TPZShapeLinear::ShapeInternal(outvalvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));//ordin = ordem de um lado
			TransformDerivativeFromRibToPrisma(rib,nshape,dphin);
			for (int i = 0; i < nshape; i++) {
				phi(shape,0) = phiblend(rib+6,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj ,rib+6)  * phin( i, 0) +
					phiblend(rib+6, 0 )   * dphin(xj,i);
				}
				shape++;
			}
		}
		//  if(order[14]<2) return;//ordem do elemento
		//face shapes
		for (int face = 0; face < 5; face++) {
			
			if((face==0 || face==4) && order[face+9]==2) continue;//estas face nao tem shapes associadas com ordem p=2
			TPZVec<REAL> outval(2);
			ProjectPoint3dPrismaToFace(face,pt,outval);
			REAL store1[20],store2[60];
			int ord1;//,ord2;
			ord1 = order[face+9];
			//ord2 = ord1;
			//elpr->FaceOrder(face,ord1,ord2);//ordem da face
			if((face==0 || face==4) && ord1<3) continue;//uma face triangular com ordem < 3 n�o tem shape associada
			int ordin;
			if(face && face<4) ordin = (ord1-1)*(ord1-1);//faces quadrilaterais
			else ordin = (ord1-2)*(ord1-1)/2;//face triangular
			TPZFMatrix<REAL> phin(ordin,1,store1,20),dphin(3,ordin,store2,60);//ponto na face
			phin.Zero();
			dphin.Zero();
			TPZManVector<int64_t> ids(4);
			//	int id0,id1,id2
			int i;
			if(face ==0 || face == 4) for(i=0;i<3;i++) ids[i] = id[FaceNodes[face][i]];
			else for(i=0;i<4;i++) ids[i] = id[FaceNodes[face][i]];
			//    id0 = ShapeFaceId[face][0];//indice das shapes da face x
			//    id1 = ShapeFaceId[face][1];//que compoem a shape atual
			//    id2 = ShapeFaceId[face][2];
			int transid;
			if(face && face<4) {
				transid = TPZShapeQuad::GetTransformId2dQ(ids);
				TPZShapeQuad::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
			} else {
				ids.Resize(3);
				transid = TPZShapeTriang::GetTransformId2dT(ids);
				outval[0] = (outval[0]+1.)/2.;//devido a corre��o na fun��o
				outval[1] = (outval[1]+1.)/2.;//Shape2dTriangleInternal(..) : correto aqui
				TPZShapeTriang::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
				int c = dphin.Cols();//isto da (p-2)(p-1)/2 ; ord1 = p ; correto aqui
				for(i=0;i<c;i++) {
					dphin(0,i) /= 2.;//correcao da derivada OK! aqui
					dphin(1,i) /= 2.;
					//dphin(2,i) /= 2.;
				}
			}
			TransformDerivativeFromFaceToPrisma(face,ordin,dphin);//ordin = numero de shapes
			for(i=0;i<ordin;i++)	{
				phi(shape,0) = phiblend(face+15,0)*phin(i,0);//face quadril�teral
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj,face+15) * phin(i ,0) +
					phiblend(face+15, 0) * dphin(xj,i);
				}
				shape++;
			}
		}
		if(order[14]<3) return;
		//volume shapes
		int ord=0;
		ord = NConnectShapeF(20,order[20-NCornerNodes]);
		TPZFNMatrix<60> phin(ord,1),dphin(3,ord);
		phin.Zero();
		dphin.Zero();
		ShapeInternal(pt,order[14],phin,dphin);
		for(int i=0;i<ord;i++)	{
			phi(shape,0) = phiblend(NSides-1,0)*phin(i,0);
			for(int xj=0;xj<3;xj++) {
				dphi(xj,shape) = dphiblend(xj,NSides-1)* phin(i ,0) +
				phiblend(NSides-1, 0)* dphin(xj,i);
			}
			shape++;
		}
		
		//}//while
		
	}